

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_183::InfoCollector::handleBreakValue(InfoCollector *this,Expression *curr)

{
  uint uVar1;
  Resume *pRVar2;
  Break *pBVar3;
  TryTable *pTVar4;
  Try *pTVar5;
  Switch *pSVar6;
  BrOn *pBVar7;
  ResumeThrow *pRVar8;
  Name *pNVar9;
  anon_class_8_1_8991fb9c local_48;
  Expression *local_40;
  anon_class_16_2_3f140c08 local_38;
  
  local_38.func = &local_48;
  local_38.expr = &local_40;
  local_48.this = this;
  local_40 = curr;
  switch(curr->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Expression::cast<wasm::Block>(curr);
    break;
  case IfId:
    Expression::cast<wasm::If>(curr);
    break;
  case LoopId:
    Expression::cast<wasm::Loop>(curr);
    break;
  case BreakId:
    pBVar3 = Expression::cast<wasm::Break>(curr);
    goto LAB_008e4fbf;
  case SwitchId:
    pSVar6 = Expression::cast<wasm::Switch>(curr);
    BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,&pSVar6->default_);
    for (uVar1 = 0;
        (ulong)uVar1 <
        (pSVar6->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
        uVar1 = uVar1 + 1) {
      pNVar9 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pSVar6->targets).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1);
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,pNVar9);
    }
    break;
  case CallId:
    Expression::cast<wasm::Call>(curr);
    break;
  case CallIndirectId:
    Expression::cast<wasm::CallIndirect>(curr);
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(curr);
    break;
  case LocalSetId:
    Expression::cast<wasm::LocalSet>(curr);
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(curr);
    break;
  case GlobalSetId:
    Expression::cast<wasm::GlobalSet>(curr);
    break;
  case LoadId:
    Expression::cast<wasm::Load>(curr);
    break;
  case StoreId:
    Expression::cast<wasm::Store>(curr);
    break;
  case ConstId:
    Expression::cast<wasm::Const>(curr);
    break;
  case UnaryId:
    Expression::cast<wasm::Unary>(curr);
    break;
  case BinaryId:
    Expression::cast<wasm::Binary>(curr);
    break;
  case SelectId:
    Expression::cast<wasm::Select>(curr);
    break;
  case DropId:
    Expression::cast<wasm::Drop>(curr);
    break;
  case ReturnId:
    Expression::cast<wasm::Return>(curr);
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(curr);
    break;
  case MemoryGrowId:
    Expression::cast<wasm::MemoryGrow>(curr);
    break;
  case NopId:
    Expression::cast<wasm::Nop>(curr);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(curr);
    break;
  case AtomicRMWId:
    Expression::cast<wasm::AtomicRMW>(curr);
    break;
  case AtomicCmpxchgId:
    Expression::cast<wasm::AtomicCmpxchg>(curr);
    break;
  case AtomicWaitId:
    Expression::cast<wasm::AtomicWait>(curr);
    break;
  case AtomicNotifyId:
    Expression::cast<wasm::AtomicNotify>(curr);
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(curr);
    break;
  case SIMDExtractId:
    Expression::cast<wasm::SIMDExtract>(curr);
    break;
  case SIMDReplaceId:
    Expression::cast<wasm::SIMDReplace>(curr);
    break;
  case SIMDShuffleId:
    Expression::cast<wasm::SIMDShuffle>(curr);
    break;
  case SIMDTernaryId:
    Expression::cast<wasm::SIMDTernary>(curr);
    break;
  case SIMDShiftId:
    Expression::cast<wasm::SIMDShift>(curr);
    break;
  case SIMDLoadId:
    Expression::cast<wasm::SIMDLoad>(curr);
    break;
  case SIMDLoadStoreLaneId:
    Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    break;
  case MemoryInitId:
    Expression::cast<wasm::MemoryInit>(curr);
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(curr);
    break;
  case MemoryCopyId:
    Expression::cast<wasm::MemoryCopy>(curr);
    break;
  case MemoryFillId:
    Expression::cast<wasm::MemoryFill>(curr);
    break;
  case PopId:
    Expression::cast<wasm::Pop>(curr);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(curr);
    break;
  case RefIsNullId:
    Expression::cast<wasm::RefIsNull>(curr);
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(curr);
    break;
  case RefEqId:
    Expression::cast<wasm::RefEq>(curr);
    break;
  case TableGetId:
    Expression::cast<wasm::TableGet>(curr);
    break;
  case TableSetId:
    Expression::cast<wasm::TableSet>(curr);
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(curr);
    break;
  case TableGrowId:
    Expression::cast<wasm::TableGrow>(curr);
    break;
  case TableFillId:
    Expression::cast<wasm::TableFill>(curr);
    break;
  case TableCopyId:
    Expression::cast<wasm::TableCopy>(curr);
    break;
  case TableInitId:
    Expression::cast<wasm::TableInit>(curr);
    break;
  case TryId:
    pTVar5 = Expression::cast<wasm::Try>(curr);
    pNVar9 = &pTVar5->delegateTarget;
    goto LAB_008e50bd;
  case TryTableId:
    pTVar4 = Expression::cast<wasm::TryTable>(curr);
    for (uVar1 = 0;
        (ulong)uVar1 <
        (pTVar4->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
        ; uVar1 = uVar1 + 1) {
      pNVar9 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pTVar4->catchDests).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1);
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,pNVar9);
    }
    break;
  case ThrowId:
    Expression::cast<wasm::Throw>(curr);
    break;
  case RethrowId:
    pBVar3 = (Break *)Expression::cast<wasm::Rethrow>(curr);
LAB_008e4fbf:
    pNVar9 = &pBVar3->name;
    goto LAB_008e50bd;
  case ThrowRefId:
    Expression::cast<wasm::ThrowRef>(curr);
    break;
  case TupleMakeId:
    Expression::cast<wasm::TupleMake>(curr);
    break;
  case TupleExtractId:
    Expression::cast<wasm::TupleExtract>(curr);
    break;
  case RefI31Id:
    Expression::cast<wasm::RefI31>(curr);
    break;
  case I31GetId:
    Expression::cast<wasm::I31Get>(curr);
    break;
  case CallRefId:
    Expression::cast<wasm::CallRef>(curr);
    break;
  case RefTestId:
    Expression::cast<wasm::RefTest>(curr);
    break;
  case RefCastId:
    Expression::cast<wasm::RefCast>(curr);
    break;
  case BrOnId:
    pBVar7 = Expression::cast<wasm::BrOn>(curr);
    pNVar9 = &pBVar7->name;
LAB_008e50bd:
    BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,pNVar9);
    break;
  case StructNewId:
    Expression::cast<wasm::StructNew>(curr);
    break;
  case StructGetId:
    Expression::cast<wasm::StructGet>(curr);
    break;
  case StructSetId:
    Expression::cast<wasm::StructSet>(curr);
    break;
  case StructRMWId:
    Expression::cast<wasm::StructRMW>(curr);
    break;
  case StructCmpxchgId:
    Expression::cast<wasm::StructCmpxchg>(curr);
    break;
  case ArrayNewId:
    Expression::cast<wasm::ArrayNew>(curr);
    break;
  case ArrayNewDataId:
    Expression::cast<wasm::ArrayNewData>(curr);
    break;
  case ArrayNewElemId:
    Expression::cast<wasm::ArrayNewElem>(curr);
    break;
  case ArrayNewFixedId:
    Expression::cast<wasm::ArrayNewFixed>(curr);
    break;
  case ArrayGetId:
    Expression::cast<wasm::ArrayGet>(curr);
    break;
  case ArraySetId:
    Expression::cast<wasm::ArraySet>(curr);
    break;
  case ArrayLenId:
    Expression::cast<wasm::ArrayLen>(curr);
    break;
  case ArrayCopyId:
    Expression::cast<wasm::ArrayCopy>(curr);
    break;
  case ArrayFillId:
    Expression::cast<wasm::ArrayFill>(curr);
    break;
  case ArrayInitDataId:
    Expression::cast<wasm::ArrayInitData>(curr);
    break;
  case ArrayInitElemId:
    Expression::cast<wasm::ArrayInitElem>(curr);
    break;
  case RefAsId:
    Expression::cast<wasm::RefAs>(curr);
    break;
  case StringNewId:
    Expression::cast<wasm::StringNew>(curr);
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(curr);
    break;
  case StringMeasureId:
    Expression::cast<wasm::StringMeasure>(curr);
    break;
  case StringEncodeId:
    Expression::cast<wasm::StringEncode>(curr);
    break;
  case StringConcatId:
    Expression::cast<wasm::StringConcat>(curr);
    break;
  case StringEqId:
    Expression::cast<wasm::StringEq>(curr);
    break;
  case StringWTF16GetId:
    Expression::cast<wasm::StringWTF16Get>(curr);
    break;
  case StringSliceWTFId:
    Expression::cast<wasm::StringSliceWTF>(curr);
    break;
  case ContNewId:
    Expression::cast<wasm::ContNew>(curr);
    break;
  case ContBindId:
    Expression::cast<wasm::ContBind>(curr);
    break;
  case SuspendId:
    Expression::cast<wasm::Suspend>(curr);
    break;
  case ResumeId:
    pRVar2 = Expression::cast<wasm::Resume>(curr);
    for (uVar1 = 0;
        (ulong)uVar1 <
        (pRVar2->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements; uVar1 = uVar1 + 1) {
      pNVar9 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pRVar2->handlerBlocks).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1);
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,pNVar9);
    }
    break;
  case ResumeThrowId:
    pRVar8 = Expression::cast<wasm::ResumeThrow>(curr);
    for (uVar1 = 0;
        (ulong)uVar1 <
        (pRVar8->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
        usedElements; uVar1 = uVar1 + 1) {
      pNVar9 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pRVar8->handlerBlocks).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar1);
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()(&local_38,pNVar9);
    }
    break;
  case StackSwitchId:
    Expression::cast<wasm::StackSwitch>(curr);
  }
  return;
}

Assistant:

void handleBreakValue(Expression* curr) {
    BranchUtils::operateOnScopeNameUsesAndSentValues(
      curr, [&](Name target, Expression* value) {
        if (value && isRelevant(value->type)) {
          for (Index i = 0; i < value->type.size(); i++) {
            // Breaks send the contents of the break value to the branch target
            // that the break goes to.
            info.links.push_back({ExpressionLocation{value, i},
                                  getBreakTargetLocation(target, i)});
          }
        }
      });
  }